

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void calculateShadowEdgesRoi(Mat *img,Rect *roi_to_clear,Mat *edge_image,int canny_thrs)

{
  int iVar1;
  int in_R8D;
  undefined1 local_318 [32];
  Point_<int> local_2f8;
  Mat local_2f0 [96];
  _InputArray local_290;
  _OutputArray local_278;
  _InputArray local_260;
  undefined1 local_248 [32];
  Point_<int> local_228;
  Mat local_220 [96];
  _InputArray local_1c0;
  _OutputArray local_1a8;
  _InputArray local_190;
  double local_178;
  _InputArray local_170;
  _InputArray local_158 [4];
  _OutputArray local_f8;
  _InputArray local_e0;
  _InputArray local_c8;
  _InputArray local_b0;
  Mat local_88 [8];
  Mat img_gray;
  int canny_thrs_local;
  Mat *edge_image_local;
  Rect *roi_to_clear_local;
  Mat *img_local;
  
  cv::Mat::Mat(local_88);
  iVar1 = cv::Mat::channels(img);
  if (iVar1 == 1) {
    cv::Mat::operator=(local_88,img);
  }
  else {
    cv::_InputArray::_InputArray(&local_b0,img);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_c8,local_88);
    cv::cvtColor((cv *)&local_b0,&local_c8,(_OutputArray *)0x6,0,in_R8D);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_c8);
    cv::_InputArray::~_InputArray(&local_b0);
  }
  cv::_InputArray::_InputArray(&local_e0,local_88);
  cv::_OutputArray::_OutputArray(&local_f8,edge_image);
  cv::Canny(&local_e0,&local_f8,(double)canny_thrs,(double)canny_thrs,3,false);
  cv::_OutputArray::~_OutputArray(&local_f8);
  cv::_InputArray::~_InputArray(&local_e0);
  cv::Mat::operator()((Mat *)local_158,(Rect *)edge_image);
  local_178 = 0.0;
  cv::_InputArray::_InputArray(&local_170,&local_178);
  cv::noArray();
  cv::Mat::setTo(local_158,&local_170);
  cv::_InputArray::~_InputArray(&local_170);
  cv::Mat::~Mat((Mat *)local_158);
  cv::_InputArray::_InputArray(&local_190,edge_image);
  cv::_OutputArray::_OutputArray(&local_1a8,edge_image);
  cv::Mat::Mat(local_220);
  cv::_InputArray::_InputArray(&local_1c0,local_220);
  cv::Point_<int>::Point_(&local_228,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_190,&local_1a8,&local_1c0,&local_228,1,0,local_248);
  cv::_InputArray::~_InputArray(&local_1c0);
  cv::Mat::~Mat(local_220);
  cv::_OutputArray::~_OutputArray(&local_1a8);
  cv::_InputArray::~_InputArray(&local_190);
  cv::_InputArray::_InputArray(&local_260,edge_image);
  cv::_OutputArray::_OutputArray(&local_278,edge_image);
  cv::Mat::Mat(local_2f0);
  cv::_InputArray::_InputArray(&local_290,local_2f0);
  cv::Point_<int>::Point_(&local_2f8,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_260,&local_278,&local_290,&local_2f8,1,0,local_318);
  cv::_InputArray::~_InputArray(&local_290);
  cv::Mat::~Mat(local_2f0);
  cv::_OutputArray::~_OutputArray(&local_278);
  cv::_InputArray::~_InputArray(&local_260);
  cv::Mat::~Mat(local_88);
  return;
}

Assistant:

void calculateShadowEdgesRoi(const cv::Mat& img,
    const cv::Rect& roi_to_clear,
    cv::Mat& edge_image,
    int canny_thrs)
{
    cv::Mat img_gray;
    if (img.channels() == 1)
    {
        img_gray = img;
    }
    else
    {
        cv::cvtColor(img, img_gray, cv::COLOR_BGR2GRAY);
    }
    cv::Canny(img_gray, edge_image, canny_thrs, canny_thrs);
    edge_image(roi_to_clear).setTo(0);
    cv::dilate(edge_image, edge_image, cv::Mat());
    cv::dilate(edge_image, edge_image, cv::Mat());
}